

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

void length(lzma_range_encoder *rc,lzma_length_encoder *lc,uint32_t pos_state,uint32_t len,
           _Bool fast_mode)

{
  uint32_t *puVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (0x111 < len) {
    __assert_fail("len <= MATCH_LEN_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                  ,0x74,
                  "void length(lzma_range_encoder *, lzma_length_encoder *, const uint32_t, uint32_t, const _Bool)"
                 );
  }
  sVar2 = rc->count;
  if (len - 2 < 8) {
    rc->symbols[sVar2] = RC_BIT_0;
    rc->probs[sVar2] = &lc->choice;
    rc->count = sVar2 + 1;
    lVar3 = sVar2 + 0x23;
    uVar4 = 1;
    uVar5 = 2;
    do {
      bVar6 = (len - 2 >> (uVar5 & 0x1f) & 1) != 0;
      *(uint *)((long)rc + lVar3 * 4 + -0x60) = (uint)bVar6;
      *(probability **)(rc->symbols + lVar3 * 2 + -10) = lc->low[pos_state] + uVar4;
      uVar4 = (ulong)((uint)bVar6 + (int)uVar4 * 2);
      lVar3 = lVar3 + 1;
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  else {
    rc->symbols[sVar2] = RC_BIT_1;
    rc->probs[sVar2] = &lc->choice;
    rc->count = sVar2 + 1;
    if (len - 10 < 8) {
      rc->symbols[sVar2 + 1] = RC_BIT_0;
      rc->probs[sVar2 + 1] = &lc->choice2;
      rc->count = sVar2 + 2;
      lVar3 = sVar2 + 0x24;
      uVar4 = 1;
      uVar5 = 2;
      do {
        bVar6 = (len - 10 >> (uVar5 & 0x1f) & 1) != 0;
        *(uint *)((long)rc + lVar3 * 4 + -0x60) = (uint)bVar6;
        *(probability **)(rc->symbols + lVar3 * 2 + -10) = lc->mid[pos_state] + uVar4;
        uVar4 = (ulong)((uint)bVar6 + (int)uVar4 * 2);
        lVar3 = lVar3 + 1;
        bVar6 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar6);
    }
    else {
      rc->symbols[sVar2 + 1] = RC_BIT_1;
      rc->probs[sVar2 + 1] = &lc->choice2;
      rc->count = sVar2 + 2;
      lVar3 = sVar2 + 0x24;
      uVar4 = 1;
      uVar5 = 7;
      do {
        bVar6 = (len - 0x12 >> (uVar5 & 0x1f) & 1) != 0;
        *(uint *)((long)rc + lVar3 * 4 + -0x60) = (uint)bVar6;
        *(probability **)(rc->symbols + lVar3 * 2 + -10) = lc->high + uVar4;
        uVar4 = (ulong)((uint)bVar6 + (int)uVar4 * 2);
        lVar3 = lVar3 + 1;
        bVar6 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar6);
    }
  }
  rc->count = lVar3 - 0x22;
  if (!fast_mode) {
    puVar1 = lc->counters + pos_state;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      length_update_prices(lc,pos_state);
      return;
    }
  }
  return;
}

Assistant:

static inline void
length(lzma_range_encoder *rc, lzma_length_encoder *lc,
		const uint32_t pos_state, uint32_t len, const bool fast_mode)
{
	assert(len <= MATCH_LEN_MAX);
	len -= MATCH_LEN_MIN;

	if (len < LEN_LOW_SYMBOLS) {
		rc_bit(rc, &lc->choice, 0);
		rc_bittree(rc, lc->low[pos_state], LEN_LOW_BITS, len);
	} else {
		rc_bit(rc, &lc->choice, 1);
		len -= LEN_LOW_SYMBOLS;

		if (len < LEN_MID_SYMBOLS) {
			rc_bit(rc, &lc->choice2, 0);
			rc_bittree(rc, lc->mid[pos_state], LEN_MID_BITS, len);
		} else {
			rc_bit(rc, &lc->choice2, 1);
			len -= LEN_MID_SYMBOLS;
			rc_bittree(rc, lc->high, LEN_HIGH_BITS, len);
		}
	}

	// Only getoptimum uses the prices so don't update the table when
	// in fast mode.
	if (!fast_mode)
		if (--lc->counters[pos_state] == 0)
			length_update_prices(lc, pos_state);
}